

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

void install_stars(void)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Wrapper *pAVar6;
  Am_Object *pAVar7;
  time_t tVar8;
  Am_Value *this;
  uint uVar9;
  Am_Style *pAVar10;
  int iVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Am_Style color;
  Am_Object star_proto;
  Am_Object local_50;
  Am_Object local_48;
  Am_Point_List star_pl;
  
  Am_Point_List::Am_Point_List(&star_pl,install_stars::star_ar,0xc);
  Am_Object::Create((char *)&color);
  pAVar6 = Am_Point_List::operator_cast_to_Am_Wrapper_(&star_pl);
  pAVar7 = (Am_Object *)Am_Object::Set((ushort)&color,(Am_Wrapper *)0xb2,(ulong)pAVar6);
  Am_Object::Am_Object(&star_proto,pAVar7);
  Am_Object::~Am_Object((Am_Object *)&color);
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
  Am_Style::Am_Style(&color);
  iVar11 = 0x3c;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    iVar2 = rand();
    iVar3 = rand();
    iVar4 = rand();
    fVar13 = (float)scrollable_width_init;
    iVar5 = rand();
    fVar14 = (float)scrollable_height_init;
    this = (Am_Value *)Am_Object::Get(0xf0a8,0x87);
    bVar12 = Am_Value::operator_cast_to_bool(this);
    pAVar10 = (Am_Style *)&Am_White;
    if (bVar12) {
      fVar15 = (float)iVar3 * 4.656613e-10;
      pAVar10 = (Am_Style *)&Am_Yellow;
      if ((((0.15 <= fVar15) && (pAVar10 = (Am_Style *)&Am_Red, 0.3 <= fVar15)) &&
          (pAVar10 = (Am_Style *)&Am_Blue, 0.45 <= fVar15)) &&
         (pAVar10 = (Am_Style *)&Am_White, fVar15 < 0.6)) {
        pAVar10 = (Am_Style *)&Am_Purple;
      }
    }
    Am_Style::operator=(&color,pAVar10);
    Am_Object::Create((char *)&local_50);
    pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_(&color);
    uVar1 = Am_Object::Set((ushort)&local_50,(Am_Wrapper *)0x6b,(ulong)pAVar6);
    uVar1 = Am_Object::Set(uVar1,100,(ulong)(uint)(int)((float)iVar4 * 4.656613e-10 * fVar13));
    uVar1 = Am_Object::Set(uVar1,0x65,(ulong)(uint)(int)((float)iVar5 * 4.656613e-10 * fVar14));
    uVar9 = (uint)((float)iVar2 * 4.656613e-10 * 20.0);
    uVar1 = Am_Object::Set(uVar1,0x66,(ulong)uVar9);
    pAVar7 = (Am_Object *)Am_Object::Set(uVar1,0x67,(ulong)uVar9);
    Am_Object::Am_Object(&local_48,pAVar7);
    Am_Object::Add_Part((Am_Object)0x10e3e0,SUB81(&local_48,0),1);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_50);
  }
  Am_Style::~Am_Style(&color);
  Am_Object::~Am_Object(&star_proto);
  Am_Point_List::~Am_Point_List(&star_pl);
  return;
}

Assistant:

void
install_stars()
{

  static int star_ar[12] = {100, 0, 159, 181, 5, 69, 195, 69, 41, 181, 100, 0};
  Am_Point_List star_pl(star_ar, 12);
  int left, top, width, height;

  Am_Object star_proto =
      Am_Polygon.Create("SP_Star_Proto").Set(Am_POINT_LIST, star_pl);

  srand((unsigned)time(nullptr)); //init random generator
  Am_Style color;

  for (int i = 0; i < NUM_STARS; i++) {
    float size_r = ((float)rand()) / RAND_MAX;
    float color_r = ((float)rand()) / RAND_MAX;
    width = (int)(size_r * 20);
    height = (int)(size_r * 20);
    left = (int)((((float)rand()) / RAND_MAX) * scrollable_width_init);
    top = (int)((((float)rand()) / RAND_MAX) * scrollable_height_init);
    if (!(bool)Am_Screen.Get(Am_IS_COLOR))
      color = Am_White;
    else if (color_r < 0.15)
      color = Am_Yellow;
    else if (color_r < 0.3)
      color = Am_Red;
    else if (color_r < 0.45)
      color = Am_Blue;
    else if (color_r < 0.6)
      color = Am_Purple;
    else
      color = Am_White;

    SP_Star_Agg.Add_Part(star_proto.Create()
                             .Set(Am_LINE_STYLE, color)
                             .Set(Am_LEFT, left)
                             .Set(Am_TOP, top)
                             .Set(Am_WIDTH, width)
                             .Set(Am_HEIGHT, height));
  }
}